

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::getIterate(Highs *this)

{
  pointer pHVar1;
  HighsStatus HVar2;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  pointer local_48;
  pointer pHStack_40;
  pointer local_38;
  pointer local_30;
  pointer pHStack_28;
  pointer local_20;
  
  if ((this->ekk_instance_).status_.initialised_for_new_lp == false) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getIterate: no simplex iterate to get\n");
    HVar2 = kError;
  }
  else {
    HVar2 = HEkk::getIterate(&this->ekk_instance_);
    if (HVar2 == kOk) {
      HEkk::getHighsBasis((HighsBasis *)local_78,&this->ekk_instance_,&(this->model_).lp_);
      (this->basis_).debug_update_count = local_78._8_4_;
      (this->basis_).valid = (bool)local_78[0];
      (this->basis_).alien = (bool)local_78[1];
      (this->basis_).useful = (bool)local_78[2];
      (this->basis_).was_alien = (bool)local_78[3];
      (this->basis_).debug_id = local_78._4_4_;
      std::__cxx11::string::operator=
                ((string *)&(this->basis_).debug_origin_name,(string *)&local_68);
      pHVar1 = (this->basis_).col_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->basis_).col_status.
      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = local_48;
      (this->basis_).col_status.
      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = pHStack_40;
      (this->basis_).col_status.
      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_38;
      local_48 = (pointer)0x0;
      pHStack_40 = (pointer)0x0;
      local_38 = (pointer)0x0;
      if (pHVar1 != (pointer)0x0) {
        operator_delete(pHVar1);
      }
      pHVar1 = (this->basis_).row_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->basis_).row_status.
      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start = local_30;
      (this->basis_).row_status.
      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_finish = pHStack_28;
      (this->basis_).row_status.
      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_20;
      local_30 = (pointer)0x0;
      pHStack_28 = (pointer)0x0;
      local_20 = (pointer)0x0;
      if (pHVar1 != (pointer)0x0) {
        operator_delete(pHVar1);
      }
      if (local_30 != (pointer)0x0) {
        operator_delete(local_30);
      }
      if (local_48 != (pointer)0x0) {
        operator_delete(local_48);
      }
      if (local_68._M_p != local_58) {
        operator_delete(local_68._M_p);
      }
      invalidateModelStatusSolutionAndInfo(this);
      HVar2 = returnFromHighs(this,kOk);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::getIterate() {
  // Check that there is a simplex iterate to get
  if (!ekk_instance_.status_.initialised_for_new_lp) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getIterate: no simplex iterate to get\n");
    return HighsStatus::kError;
  }
  HighsStatus call_status = ekk_instance_.getIterate();
  if (call_status != HighsStatus::kOk) return call_status;
  // Get the corresponding HiGHS basis
  basis_ = ekk_instance_.getHighsBasis(model_.lp_);
  // Clear everything else
  invalidateModelStatusSolutionAndInfo();
  return returnFromHighs(HighsStatus::kOk);
}